

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::decodeDouble(OurReader *this,Token *token,Value *decoded)

{
  undefined8 uVar1;
  long in_RSI;
  String buffer_1;
  Char buffer [33];
  char format [4];
  size_t ulength;
  ptrdiff_t length;
  int count;
  int bufferSize;
  double value;
  char *in_stack_fffffffffffffe48;
  Value *other;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  allocator<char> *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *in_stack_fffffffffffffe60;
  char *__end;
  char *in_stack_fffffffffffffe68;
  allocator<char> *__beg;
  Value *in_stack_fffffffffffffe70;
  Location in_stack_fffffffffffffea8;
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  in_stack_fffffffffffffeb0;
  String *in_stack_fffffffffffffeb8;
  OurReader *in_stack_fffffffffffffec0;
  allocator<char> local_131;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [39];
  allocator<char> local_c9;
  string local_c8 [32];
  undefined1 local_a8 [44];
  undefined4 local_7c;
  size_t local_78;
  allocator local_59;
  string local_58 [32];
  size_t local_38;
  int local_30;
  undefined4 local_2c;
  undefined8 local_28 [2];
  long local_18;
  byte local_1;
  
  local_28[0] = 0;
  local_2c = 0x20;
  local_78 = *(long *)(in_RSI + 0x10) - *(long *)(in_RSI + 8);
  local_38 = local_78;
  if ((long)local_78 < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"Unable to parse token length",&local_59);
    local_1 = addError(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                       (Token *)in_stack_fffffffffffffeb0._M_head_impl,in_stack_fffffffffffffea8);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  else {
    local_7c = 0x666c25;
    local_18 = in_RSI;
    if ((long)local_78 < 0x21) {
      memcpy(local_a8,*(void **)(in_RSI + 8),local_78);
      local_a8[local_38] = 0;
      fixNumericLocaleInput<char*>
                ((char *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe48);
      local_30 = __isoc99_sscanf(local_a8,&local_7c,local_28);
    }
    else {
      in_stack_fffffffffffffe70 = *(Value **)(in_RSI + 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                 in_stack_fffffffffffffe58);
      std::allocator<char>::~allocator(&local_c9);
      uVar1 = std::__cxx11::string::c_str();
      local_30 = __isoc99_sscanf(uVar1,&local_7c,local_28);
      std::__cxx11::string::~string(local_c8);
    }
    if (local_30 == 1) {
      other = (Value *)&stack0xfffffffffffffea0;
      Value::Value(in_stack_fffffffffffffe70,(double)in_stack_fffffffffffffe68);
      Value::operator=((Value *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),other)
      ;
      Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
      local_1 = 1;
    }
    else {
      __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(local_18 + 8);
      __end = *(char **)(local_18 + 0x10);
      __beg = &local_131;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe70,(char *)__beg,__end,(allocator<char> *)__lhs);
      std::operator+((char *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
      std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
      local_1 = addError(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                         (Token *)in_stack_fffffffffffffeb0._M_head_impl,in_stack_fffffffffffffea8);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string(local_110);
      std::__cxx11::string::~string(local_130);
      std::allocator<char>::~allocator(&local_131);
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OurReader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  const int bufferSize = 32;
  int count;
  ptrdiff_t const length = token.end_ - token.start_;

  // Sanity check to avoid buffer overflow exploits.
  if (length < 0) {
    return addError("Unable to parse token length", token);
  }
  auto const ulength = static_cast<size_t>(length);

  // Avoid using a string constant for the format control string given to
  // sscanf, as this can cause hard to debug crashes on OS X. See here for more
  // info:
  //
  //     http://developer.apple.com/library/mac/#DOCUMENTATION/DeveloperTools/gcc-4.0.1/gcc/Incompatibilities.html
  char format[] = "%lf";

  if (length <= bufferSize) {
    Char buffer[bufferSize + 1];
    memcpy(buffer, token.start_, ulength);
    buffer[length] = 0;
    fixNumericLocaleInput(buffer, buffer + length);
    count = sscanf(buffer, format, &value);
  } else {
    String buffer(token.start_, token.end_);
    count = sscanf(buffer.c_str(), format, &value);
  }

  if (count != 1)
    return addError(
        "'" + String(token.start_, token.end_) + "' is not a number.", token);
  decoded = value;
  return true;
}